

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRegistry.h
# Opt level: O3

void __thiscall
anurbs::TypeEntry<anurbs::BrepTrim,_anurbs::Model>::~TypeEntry
          (TypeEntry<anurbs::BrepTrim,_anurbs::Model> *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

bool load(TModel& model, const Json& source) override
    {
        const auto key = key_from_json(source);

        Pointer<TData> data = TData::load(model, source);

        Ref<TData> ref;

        if (key.empty()) {
            ref = model.template add<TData>(data);
        } else {
            ref = model.template add<TData>(key, data);
        }

        ref.attributes()->load(model, source);

        return true;
    }